

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

void mpickup_obj(monst *mtmp,obj *otmp)

{
  int iVar1;
  char *pcVar2;
  char *local_30;
  char *local_20;
  obj *otmp_local;
  monst *mtmp_local;
  
  if (((otmp->otyp == 0x214) &&
      ((((mtmp->data->msound == '\x1f' || (mtmp->data == mons + 0x11b)) ||
        (mtmp->data == mons + 0x144)) ||
       ((mtmp->data == mons + 0x146 || (mtmp->data == mons + 0x145)))))) &&
     ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      pline("A thunderclap rings out!");
    }
    else {
      iVar1 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
      if (iVar1 < 6) {
        local_20 = doname(otmp);
      }
      else {
        local_20 = distant_name(otmp,doname);
      }
      pline("A thunderclap rings out, and %s shatters!",local_20);
      pcVar2 = Monnam(mtmp);
      pline("%s strides through the dust cloud.",pcVar2);
    }
  }
  else if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (flags.verbose != '\0')) {
    pcVar2 = Monnam(mtmp);
    iVar1 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
    if (iVar1 < 6) {
      local_30 = doname(otmp);
    }
    else {
      local_30 = distant_name(otmp,doname);
    }
    pline("%s picks up %s.",pcVar2,local_30);
  }
  if (((otmp->otyp == 0x214) &&
      ((((mtmp->data->msound == '\x1f' || (mtmp->data == mons + 0x11b)) ||
        (mtmp->data == mons + 0x144)) ||
       ((mtmp->data == mons + 0x146 || (mtmp->data == mons + 0x145)))))) &&
     ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0)) {
    remove_object(otmp);
  }
  else {
    obj_extract_self(otmp);
    mpickobj(mtmp,otmp);
  }
  m_dowear(level,mtmp,'\0');
  newsym((int)mtmp->mx,(int)mtmp->my);
  return;
}

Assistant:

void mpickup_obj(struct monst *mtmp, struct obj *otmp)
{
	if (otmp->otyp == BOULDER && is_rockbreaker(mtmp)) {
	    if (cansee(mtmp->mx,mtmp->my)) {
		pline("A thunderclap rings out, and %s shatters!",
		      (distu(mtmp->mx, mtmp->my) <= 5) ?
		      doname(otmp) : distant_name(otmp, doname));
		pline("%s strides through the dust cloud.", Monnam(mtmp));
	    } else {
		pline("A thunderclap rings out!");
	    }
	} else {
	    if (cansee(mtmp->mx,mtmp->my) && flags.verbose) {
		pline("%s picks up %s.", Monnam(mtmp),
		      (distu(mtmp->mx, mtmp->my) <= 5) ?
		      doname(otmp) : distant_name(otmp, doname));
	    }
	}
	if (otmp->otyp == BOULDER && is_rockbreaker(mtmp)) {
	    remove_object(otmp);
	} else {
	    obj_extract_self(otmp);
	    mpickobj(mtmp, otmp);	/* may merge and free otmp */
	}
	m_dowear(level, mtmp, FALSE);
	newsym(mtmp->mx, mtmp->my);
}